

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

void __thiscall Assimp::HMPImporter::ValidateHeader_HMP457(HMPImporter *this)

{
  uchar *puVar1;
  runtime_error *prVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->super_MDLImporter).iFileSize < 0x78) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,
               "HMP file is too small (header size is 120 bytes, this file is smaller)","");
    std::runtime_error::runtime_error(prVar2,(string *)local_40);
    *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->super_MDLImporter).mBuffer;
  if ((*(float *)(puVar1 + 0x24) != 0.0) || (NAN(*(float *)(puVar1 + 0x24)))) {
    if ((*(float *)(puVar1 + 0x28) != 0.0) || (NAN(*(float *)(puVar1 + 0x28)))) {
      if ((1.0 <= *(float *)(puVar1 + 0x2c)) &&
         (1.0 <= (float)*(int *)(puVar1 + 0x3c) / *(float *)(puVar1 + 0x2c))) {
        if (*(int *)(puVar1 + 0x44) != 0) {
          return;
        }
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"There are no frames. At least one should be there","");
        std::runtime_error::runtime_error(prVar2,(string *)local_40);
        *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Number of triangles in either x or y direction is zero","");
      std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Size of triangles in either  x or y direction is zero","");
  std::runtime_error::runtime_error(prVar2,(string *)local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HMPImporter::ValidateHeader_HMP457( )
{
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    if (120 > iFileSize)
    {
        throw DeadlyImportError("HMP file is too small (header size is "
            "120 bytes, this file is smaller)");
    }

    if (!pcHeader->ftrisize_x || !pcHeader->ftrisize_y)
        throw DeadlyImportError("Size of triangles in either  x or y direction is zero");

    if(pcHeader->fnumverts_x < 1.0f || (pcHeader->numverts/pcHeader->fnumverts_x) < 1.0f)
        throw DeadlyImportError("Number of triangles in either x or y direction is zero");

    if(!pcHeader->numframes)
        throw DeadlyImportError("There are no frames. At least one should be there");

}